

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLSLMaterialRenderer::OnUnsetMaterial(COpenGLSLMaterialRenderer *this)

{
  code *pcVar1;
  COpenGLCacheHandler *this_00;
  ulong __n;
  
  if ((this->Program != 0) &&
     (pcVar1 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x758),
     pcVar1 != (code *)0x0)) {
    (*pcVar1)(0);
  }
  if ((this->Program2 != 0) &&
     (pcVar1 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x770),
     pcVar1 != (code *)0x0)) {
    (*pcVar1)(0);
  }
  this_00 = COpenGLDriver::getCacheHandler
                      (*(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x10);
  if (((this->Alpha != false) || (this->Blending == true)) &&
     ((*(this_00->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).Blend != false ||
      ((this_00->
       super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
       ).BlendInvalid == true)))) {
    (*GL.Disable)(0xbe2);
    __n = (ulong)(this_00->
                 super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ).FrameBufferCount;
    if (__n != 0) {
      memset((this_00->
             super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
             ).Blend,0,__n);
    }
    (this_00->
    super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ).BlendInvalid = false;
  }
  if ((this->Alpha == false) && (this->AlphaTest != true)) {
    return;
  }
  COpenGLCacheHandler::setAlphaTest(this_00,false);
  return;
}

Assistant:

void COpenGLSLMaterialRenderer::OnUnsetMaterial()
{
	if (Program)
		Driver->extGlUseProgramObject(0);
	if (Program2)
		Driver->irrGlUseProgram(0);

	COpenGLCacheHandler *cacheHandler = Driver->getCacheHandler();
	if (Alpha || Blending) {
		cacheHandler->setBlend(false);
	}
	if (Alpha || AlphaTest) {
		cacheHandler->setAlphaTest(false);
	}
}